

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuProcessImage.h
# Opt level: O1

void __thiscall
gpu::ImageProcessing<unsigned_char>::applyConvolution
          (ImageProcessing<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,int *kernel,
          int imageWidth,int imageHeight,int spectrum,int kernelSize,int normal)

{
  int iVar1;
  int iVar2;
  int channel;
  int iVar3;
  int offset;
  int local_64;
  
  if (0 < spectrum) {
    local_64 = 0;
    channel = 0;
    do {
      if (0 < imageWidth) {
        iVar3 = 0;
        iVar2 = local_64;
        do {
          iVar1 = imageHeight;
          offset = iVar2;
          if (0 < imageHeight) {
            do {
              ConvolutionFilters<unsigned_char>::applyConvolution
                        ((ConvolutionFilters<unsigned_char> *)&this->field_0x10,inputBuffer,
                         outputBuffer,kernel,imageWidth,imageHeight,kernelSize,normal,offset,channel
                        );
              offset = offset + imageWidth;
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          iVar3 = iVar3 + 1;
          iVar2 = iVar2 + 1;
        } while (iVar3 != imageWidth);
      }
      channel = channel + 1;
      local_64 = local_64 + imageHeight * imageWidth;
    } while (channel != spectrum);
  }
  return;
}

Assistant:

void ImageProcessing<T>::applyConvolution(T *inputBuffer, 
                                              T *outputBuffer, 
                                              int *kernel, 
                                              int imageWidth,
                                              int imageHeight, 
                                              int spectrum,
                                              int kernelSize,
                                              int normal)                                   
    {


      for(int channel = 0; channel < spectrum ; ++channel)
      {
        for(int j = 0; j < imageWidth; ++j)
        {
          for(int i = 0; i < imageHeight; ++i)
          {
            int offset = channel*imageWidth*imageHeight +  i * imageWidth + j;
            convolutionFilter.applyConvolution(inputBuffer,outputBuffer,kernel,imageWidth,imageHeight,kernelSize,normal,offset,channel);
          }
        }
      }
    }